

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void anon_unknown.dwarf_ea51c5::mergeSegments(Segment *a,int na,Segment *b,int nb)

{
  bool bVar1;
  Segment *this;
  Segment *other;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int rb;
  int ra;
  Segment *sb;
  Segment *sa;
  int j;
  int i;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  for (iVar3 = 0; iVar3 != in_ESI && iVar2 != in_ECX;
      iVar3 = (uint)(in_stack_ffffffffffffffc4 <= in_stack_ffffffffffffffc0) + iVar3) {
    this = (Segment *)(in_RDI + (long)iVar3 * 0x20);
    other = (Segment *)(in_RDX + (long)iVar2 * 0x20);
    in_stack_ffffffffffffffc4 =
         Segment::right((Segment *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc0 =
         Segment::right((Segment *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar1 = Segment::overlaps(this,other);
    if (bVar1) {
      Segment::merge((Segment *)CONCAT44(in_ECX,iVar3),
                     (Segment *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    }
    iVar2 = (uint)(in_stack_ffffffffffffffc0 <= in_stack_ffffffffffffffc4) + iVar2;
  }
  return;
}

Assistant:

void mergeSegments(Segment *a, int na, Segment *b, int nb)
{
    int i = 0;
    int j = 0;

    while (i != na && j != nb) {
        Segment &sa = a[i];
        Segment &sb = b[j];
        const int ra = sa.right();
        const int rb = sb.right();
        if (sa.overlaps(sb))
            sa.merge(sb);
        i += (rb >= ra);
        j += (ra >= rb);
    }
}